

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::cmExtraEclipseCDT4Generator(cmExtraEclipseCDT4Generator *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->super_cmExternalMakefileProjectGenerator).Name._M_dataplus._M_p = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).Name._M_string_length = 0;
  (this->super_cmExternalMakefileProjectGenerator).Name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->super_cmExternalMakefileProjectGenerator).Name.field_2 + 8) = 0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).Name._M_dataplus._M_p =
       (pointer)&(this->super_cmExternalMakefileProjectGenerator).Name.field_2;
  (this->super_cmExternalMakefileProjectGenerator).Name.field_2._M_local_buf[0] = '\0';
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraEclipseCDT4Generator_0068adf8;
  (this->SrcLinkedResources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SrcLinkedResources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SrcLinkedResources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
  (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->HomeDirectory)._M_dataplus._M_p = (pointer)&(this->HomeDirectory).field_2;
  (this->HomeDirectory)._M_string_length = 0;
  (this->HomeDirectory).field_2._M_local_buf[0] = '\0';
  (this->HomeOutputDirectory)._M_dataplus._M_p = (pointer)&(this->HomeOutputDirectory).field_2;
  (this->HomeOutputDirectory)._M_string_length = 0;
  (this->HomeOutputDirectory).field_2._M_local_buf[0] = '\0';
  this->GenerateLinkedResources = true;
  this->SupportsVirtualFolders = true;
  this->SupportsGmakeErrorParser = true;
  this->SupportsMachO64Parser = true;
  this->CEnabled = false;
  this->CXXEnabled = false;
  return;
}

Assistant:

cmExtraEclipseCDT4Generator::cmExtraEclipseCDT4Generator()
  : cmExternalMakefileProjectGenerator()
{
  this->SupportsVirtualFolders = true;
  this->GenerateLinkedResources = true;
  this->SupportsGmakeErrorParser = true;
  this->SupportsMachO64Parser = true;
  this->CEnabled = false;
  this->CXXEnabled = false;
}